

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

optional_ptr<duckdb::Catalog,_true>
duckdb::Catalog::GetCatalogEntry(ClientContext *context,string *catalog_name)

{
  optional_ptr<duckdb::Catalog,_true> oVar1;
  CatalogEntryRetriever entry_retriever;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  ClientContext *local_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  local_28 = context;
  oVar1 = GetCatalogEntry((CatalogEntryRetriever *)&local_48,catalog_name);
  CatalogEntryRetriever::~CatalogEntryRetriever((CatalogEntryRetriever *)&local_48);
  return (optional_ptr<duckdb::Catalog,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreatePragmaFunction(CatalogTransaction transaction,
                                                         CreatePragmaFunctionInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	return CreatePragmaFunction(transaction, schema, info);
}